

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

int INT_EVdfg_assign_node(EVdfg_stone stone,char *node_name)

{
  EVdfg p_Var1;
  EVmaster p_Var2;
  FILE *__stream;
  EVdfg_config_action act_00;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  char **ppcVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  EVdfg_config_action act;
  timespec local_50;
  uint local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  p_Var1 = stone->dfg;
  p_Var2 = p_Var1->master;
  iVar4 = p_Var2->node_count;
  if ((long)iVar4 < 1) {
    uVar8 = 0xffffffff;
  }
  else {
    ppcVar7 = &p_Var2->nodes->canonical_name;
    uVar9 = 0xffffffff;
    uVar10 = 0;
    do {
      if ((*ppcVar7 == (char *)0x0) || (iVar3 = strcmp(*ppcVar7,node_name), iVar3 != 0)) {
        if ((((_EVint_node_rec *)(ppcVar7 + -1))->name != (char *)0x0) &&
           (iVar3 = strcmp(((_EVint_node_rec *)(ppcVar7 + -1))->name,node_name), iVar3 == 0)) {
          uVar9 = uVar10 & 0xffffffff;
        }
      }
      else {
        uVar9 = uVar10 & 0xffffffff;
      }
      uVar8 = (uint)uVar9;
      uVar10 = uVar10 + 1;
      ppcVar7 = ppcVar7 + 7;
    } while ((long)iVar4 != uVar10);
  }
  if (uVar8 == 0xffffffff) {
    iVar4 = 0;
    printf("Node \"%s\" not found in node list\n",node_name);
  }
  else {
    if (p_Var1->realized == 1) {
      iVar4 = CMtrace_val[0xd];
      if (p_Var2->cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(p_Var2->cm,EVdfgVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          __stream = (FILE *)p_Var2->cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(__stream,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_50);
          fprintf((FILE *)p_Var2->cm->CMTrace_file,"%lld.%.9ld - ",
                  CONCAT44(local_50.tv_sec._4_4_,(undefined4)local_50.tv_sec),local_50.tv_nsec);
        }
        fprintf((FILE *)p_Var2->cm->CMTrace_file,"assign node, node# = %d\n",(ulong)uVar8);
      }
      fflush((FILE *)p_Var2->cm->CMTrace_file);
    }
    local_50.tv_sec._0_4_ = 0xc;
    local_50.tv_sec._4_4_ = stone->stone_id;
    act_00.stone_id = local_50.tv_sec._4_4_;
    act_00.type = 0xc;
    act_00.u.period.usecs = uStack_3c;
    act_00.u.period.secs = uVar8;
    iVar4 = 1;
    act_00._8_8_ = local_50.tv_nsec;
    act_00.u._8_8_ = uStack_38;
    local_40 = uVar8;
    EVdfg_perform_act_on_state(stone->dfg->working_state,act_00,1);
  }
  return iVar4;
}

Assistant:

extern int
INT_EVdfg_assign_node(EVdfg_stone stone, char *node_name)
{
    EVdfg dfg = stone->dfg;
    EVmaster master = dfg->master;
    int i, node = -1;
    for (i = 0; i < master->node_count; i++) {
	EVint_node_list n = &master->nodes[i];
	if (n->canonical_name && (strcmp(n->canonical_name, node_name) == 0)) {
	    node = i;
	} else 	if (n->name && (strcmp(n->name, node_name) == 0)) {
	    node = i;
	}

    }
    if (node == -1) {
	printf("Node \"%s\" not found in node list\n", node_name);
	return 0;
    }
	
    if (dfg->realized == 1) {
	CMtrace_out(master->cm, EVdfgVerbose, "assign node, node# = %d\n", node);
    }
    EVdfg_config_action act;
    act.type = ACT_assign_node;
    act.stone_id = stone->stone_id;
    act.u.assign.dest_node = node;
    (void) EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
    return 1;
}